

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Modf::doApply
          (IRet *__return_storage_ptr__,Modf *this,EvalContext *param_1,IArgs *iargs)

{
  Interval *pIVar1;
  Interval *pIVar2;
  bool bVar3;
  Interval *whole_dst_;
  Interval *whole_arg_;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double x_1;
  double intPart;
  double x;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pIVar1 = iargs->b;
  local_70 = 0.0;
  pIVar2 = iargs->a;
  local_58 = pIVar2->m_lo;
  dVar6 = pIVar2->m_hi;
  if (local_58 <= dVar6) {
    local_68 = modf(local_58,&local_70);
    dVar7 = modf(dVar6,&local_70);
    bVar3 = NAN(local_68) || NAN(dVar7);
    uVar4 = -(ulong)NAN(dVar7);
    uVar5 = -(ulong)NAN(local_68);
    auVar9._0_8_ = uVar4 & 0x7ff0000000000000;
    auVar9._8_8_ = uVar5 & 0xfff0000000000000;
    auVar11._0_8_ = ~uVar4 & (ulong)dVar7;
    auVar11._8_8_ = ~uVar5 & (ulong)local_68;
    auVar8._0_8_ = uVar4 & 0xfff0000000000000;
    auVar8._8_8_ = uVar5 & 0x7ff0000000000000;
    auVar8 = auVar8 | auVar11;
    auVar12._0_8_ = auVar8._8_8_;
    auVar12._8_4_ = auVar8._0_4_;
    auVar12._12_4_ = auVar8._4_4_;
    dVar7 = SUB168(auVar9 | auVar11,0);
    dVar10 = SUB168(auVar9 | auVar11,8);
    uVar4 = -(ulong)(auVar12._0_8_ <= dVar7);
    uVar5 = -(ulong)(auVar12._8_8_ <= dVar10);
    local_68 = (double)(~uVar4 & (ulong)dVar7 | (ulong)auVar12._0_8_ & uVar4);
    dStack_60 = (double)(~uVar5 & auVar8._0_8_ | (ulong)dVar10 & uVar5);
  }
  else {
    local_68 = INFINITY;
    dStack_60 = -INFINITY;
    bVar3 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar3;
  __return_storage_ptr__->m_lo = local_68;
  __return_storage_ptr__->m_hi = dStack_60;
  if (pIVar2->m_hasNaN == true) {
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_hi = dStack_60;
  }
  if (local_58 <= dVar6) {
    modf(local_58,&local_70);
    bVar3 = NAN(local_70);
    local_48 = INFINITY;
    if (!bVar3) {
      local_48 = local_70;
    }
    uStack_40 = 0;
    local_58 = -INFINITY;
    if (!bVar3) {
      local_58 = local_70;
    }
    uStack_50 = 0;
    modf(dVar6,&local_70);
    dVar6 = INFINITY;
    dVar7 = -INFINITY;
    if (!NAN(local_70)) {
      dVar6 = local_70;
      dVar7 = local_70;
    }
    bVar3 = bVar3 || NAN(local_70);
    dVar6 = (double)(~-(ulong)(local_48 <= dVar6) & (ulong)dVar6 |
                    (ulong)local_48 & -(ulong)(local_48 <= dVar6));
    dVar7 = (double)(~-(ulong)(dVar7 <= local_58) & (ulong)dVar7 |
                    (ulong)local_58 & -(ulong)(dVar7 <= local_58));
  }
  else {
    dVar7 = -INFINITY;
    dVar6 = INFINITY;
    bVar3 = false;
  }
  pIVar1->m_hasNaN = bVar3;
  pIVar1->m_lo = dVar6;
  pIVar1->m_hi = dVar7;
  if (pIVar2->m_hasNaN == true) {
    pIVar1->m_hasNaN = true;
    pIVar1->m_hi = dVar7;
  }
  if ((iargs->a->m_lo == -INFINITY) || (iargs->a->m_hi == INFINITY)) {
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = local_68;
    __return_storage_ptr__->m_hi = dStack_60;
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply				(const EvalContext&, const IArgs& iargs) const
	{
		Interval	fracIV;
		Interval&	wholeIV		= const_cast<Interval&>(iargs.b);
		double		intPart		= 0;

		TCU_INTERVAL_APPLY_MONOTONE1(fracIV, x, iargs.a, frac, frac = deModf(x, &intPart));
		TCU_INTERVAL_APPLY_MONOTONE1(wholeIV, x, iargs.a, whole,
									 deModf(x, &intPart); whole = intPart);

		if (!iargs.a.isFinite())
		{
			// Behavior on modf(Inf) not well-defined, allow anything as a fractional part
			// See Khronos bug 13907
			fracIV |= TCU_NAN;
		}

		return fracIV;
	}